

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scripthash.cpp
# Opt level: O0

void __thiscall ScriptHash_GetHex_Test::TestBody(ScriptHash_GetHex_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_a8;
  Message local_a0;
  string local_98;
  undefined1 local_78 [8];
  AssertionResult gtest_ar;
  ScriptHash script_hash;
  allocator local_31;
  undefined1 local_30 [8];
  string hex;
  ScriptHash_GetHex_Test *this_local;
  
  hex.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_30,"1234",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  cfd::core::ScriptHash::ScriptHash((ScriptHash *)&gtest_ar.message_,(string *)local_30);
  cfd::core::ScriptHash::GetHex_abi_cxx11_(&local_98,(ScriptHash *)&gtest_ar.message_);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_78,"script_hash.GetHex().c_str()","\"1234\"",pcVar2,"1234");
  std::__cxx11::string::~string((string *)&local_98);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(&local_a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_78);
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scripthash.cpp"
               ,0x3c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a8,&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    testing::Message::~Message(&local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  cfd::core::ScriptHash::~ScriptHash((ScriptHash *)&gtest_ar.message_);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(ScriptHash, GetHex) {
  std::string hex("1234");
  ScriptHash script_hash(hex);
  EXPECT_STREQ(script_hash.GetHex().c_str(), "1234");
}